

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogDefault.cpp
# Opt level: O2

bool Rml::LogDefault::LogMessage(Type param_1,String *message)

{
  fprintf(_stderr,"%s\n",(message->_M_dataplus)._M_p);
  return true;
}

Assistant:

bool LogDefault::LogMessage(Log::Type /*type*/, const String& message)
{
	#ifdef RMLUI_PLATFORM_EMSCRIPTEN
	puts(message.c_str());
	#else
	fprintf(stderr, "%s\n", message.c_str());
	#endif
	return true;
}